

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

void __thiscall
ON_SurfaceCurvatureColorMapping::ON_SurfaceCurvatureColorMapping
          (ON_SurfaceCurvatureColorMapping *this,curvature_style kappa_style,ON_Interval kappa_range
          )

{
  double dVar1;
  bool bVar2;
  curvature_style cVar3;
  ON_Interval *this_00;
  ON_Interval local_20;
  
  local_20.m_t[1] = kappa_range.m_t[1];
  this_00 = &local_20;
  local_20.m_t[0] = kappa_range.m_t[0];
  this->m_is_set = '\x02';
  this->m_reserved1 = '\0';
  this->m_reserved2 = 0;
  cVar3 = ON::CurvatureStyle(kappa_style);
  this->m_kappa_style = cVar3;
  bVar2 = ON_Interval::IsValid(this_00);
  if (!bVar2) {
    this_00 = &ON_Interval::Nan;
  }
  dVar1 = this_00->m_t[1];
  (this->m_kappa_range).m_t[0] = this_00->m_t[0];
  (this->m_kappa_range).m_t[1] = dVar1;
  dVar1 = DefaultHueRangeRadians.m_t[1];
  (this->m_hue_range_in_radians).m_t[0] = DefaultHueRangeRadians.m_t[0];
  (this->m_hue_range_in_radians).m_t[1] = dVar1;
  return;
}

Assistant:

ON_SurfaceCurvatureColorMapping::ON_SurfaceCurvatureColorMapping(
  ON::curvature_style kappa_style,
  ON_Interval kappa_range
)
  : m_is_set(2)
  , m_kappa_style(ON::CurvatureStyle((int)(kappa_style)))
  , m_kappa_range(kappa_range.IsValid() ? kappa_range : ON_Interval::Nan)
{}